

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void btv(void)

{
  FX *fx_addr68k;
  
  fx_addr68k = (FX *)(MachineState.pvar + -10);
  while( true ) {
    dump_stackframe(fx_addr68k);
    if (fx_addr68k->alink == 0) break;
    fx_addr68k = get_nextFX(fx_addr68k);
  }
  printf("\n BTV end");
  return;
}

Assistant:

void btv(void) {
  struct frameex1 *fx_addr68k;
  struct frameex1 *get_nextFX(FX * fx);

  fx_addr68k = CURRENTFX;

loop:
  dump_stackframe(fx_addr68k);
  if (fx_addr68k->alink == 0) {
    printf("\n BTV end");
    return;
  }

  fx_addr68k = get_nextFX(fx_addr68k);
  goto loop;
}